

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.h
# Opt level: O0

ChFrame<double> * __thiscall
chrono::ChLinkMarkers::GetVisualModelFrame
          (ChFrame<double> *__return_storage_ptr__,ChLinkMarkers *this,uint nclone)

{
  ChFrame<double> *other;
  uint nclone_local;
  ChLinkMarkers *this_local;
  
  other = (ChFrame<double> *)ChMarker::GetAbsFrame(*(ChMarker **)(this + 0xc0));
  ChFrame<double>::ChFrame(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

virtual ChFrame<> GetVisualModelFrame(unsigned int nclone = 0) override { return marker2->GetAbsFrame(); }